

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece.pb.cc
# Opt level: O2

uint8 * __thiscall
sentencepiece::SentencePieceText::_InternalSerialize
          (SentencePieceText *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  int iVar2;
  float fVar3;
  SentencePieceText_SentencePiece *this_00;
  void *pvVar4;
  uint8 *puVar5;
  ulong uVar6;
  int iVar7;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    target = google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,1,(string *)
                                 ((ulong)(this->text_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),target
                       );
  }
  iVar2 = (this->pieces_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar7 = 0; iVar2 != iVar7; iVar7 = iVar7 + 1) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    this_00 = (SentencePieceText_SentencePiece *)
              ((this->pieces_).super_RepeatedPtrFieldBase.rep_)->elements[iVar7];
    *puVar5 = '\x12';
    puVar5 = google::protobuf::io::CodedOutputStream::WriteVarint32ToArray
                       ((this_00->_cached_size_).size_.super___atomic_base<int>._M_i,puVar5 + 1);
    target = SentencePieceText_SentencePiece::_InternalSerialize(this_00,puVar5,stream);
  }
  if ((uVar1 & 2) != 0) {
    puVar5 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    fVar3 = this->score_;
    *puVar5 = '\x1d';
    *(float *)(puVar5 + 1) = fVar3;
    target = puVar5 + 5;
  }
  puVar5 = google::protobuf::internal::ExtensionSet::_InternalSerialize
                     (&this->_extensions_,200,0x20000000,target,stream);
  pvVar4 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if (((ulong)pvVar4 & 1) == 0) {
    return puVar5;
  }
  uVar6 = (ulong)pvVar4 & 0xfffffffffffffffe;
  puVar5 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                     (stream,*(void **)(uVar6 + 8),*(int *)(uVar6 + 0x10),puVar5);
  return puVar5;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* SentencePieceText::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:sentencepiece.SentencePieceText)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string text = 1;
  if (cached_has_bits & 0x00000001u) {
    target = stream->WriteStringMaybeAliased(
        1, this->_internal_text(), target);
  }

  // repeated .sentencepiece.SentencePieceText.SentencePiece pieces = 2;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_pieces_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(2, this->_internal_pieces(i), target, stream);
  }

  // optional float score = 3;
  if (cached_has_bits & 0x00000002u) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteFloatToArray(3, this->_internal_score(), target);
  }

  // Extension range [200, 536870912)
  target = _extensions_._InternalSerialize(
      200, 536870912, target, stream);

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:sentencepiece.SentencePieceText)
  return target;
}